

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crate.c
# Opt level: O3

void * dsGetIndex(void)

{
  void *pvVar1;
  long lVar2;
  ulong uVar3;
  
  pthread_once(&keyOnce,makeKey);
  pvVar1 = pthread_getspecific(key);
  if (pvVar1 == (void *)0x0) {
    dsRunLogCallback("%s(): Can\'t get active crate.\n","dsGetIndex");
  }
  else {
    uVar3 = *(ulong *)(*(long *)((long)pvVar1 + 0x30) + 0x10);
    if ((uVar3 < *(ulong *)((long)pvVar1 + 0x18)) ||
       (lVar2 = *(long *)(*(long *)((long)pvVar1 + 0x30) + 0x18),
       *(ulong *)((long)pvVar1 + 0x18) + *(long *)((long)pvVar1 + 0x20) < lVar2 + uVar3)) {
      dsRunLogCallback("%s(): Can\'t map region outside of crate.\n","mapObject");
      uVar3 = *(ulong *)(*(long *)((long)pvVar1 + 0x30) + 0x10);
      lVar2 = *(long *)(*(long *)((long)pvVar1 + 0x30) + 0x18);
    }
    else if (*(long *)((long)pvVar1 + 0x10) != 0) {
      return (void *)(*(long *)((long)pvVar1 + 0x10) + uVar3);
    }
    dsRunLogCallback("%s(): Can\'t mapObject(,%lu,%lu)\n","dsGetIndex",uVar3,lVar2);
  }
  return (void *)0xffffffffffffffff;
}

Assistant:

void *
dsGetIndex()
{
	dsCrate *crate = NULL;
	void *ptr;

	if ((crate = getActiveCrate()) == NULL) {
		dsLog("Can't get active crate.\n");
		return (void *)-1;
	}

	if ((ptr = mapObject(crate, crate->super->indexObjectOffset,
					crate->super->indexObjectLength)) == NULL) {
		dsLog("Can't mapObject(,%" PRIu64 ",%" PRIu64 ")\n",
			crate->super->indexObjectOffset,
			crate->super->indexObjectLength);
		return (void *)-1;
	}

	return ptr;
}